

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

char * fctstr_clone(char *s)

{
  size_t sVar1;
  char *dst;
  size_t klen;
  char *k;
  char *s_local;
  
  if (s == (char *)0x0) {
    __assert_fail("s != ((void*)0) && \"invalid arg\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x13a
                  ,"char *fctstr_clone(const char *)");
  }
  sVar1 = strlen(s);
  dst = (char *)malloc(sVar1 + 2);
  fctstr_safe_cpy(dst,s,sVar1 + 1);
  return dst;
}

Assistant:

static char*
fctstr_clone(char const *s)
{
    char *k =NULL;
    size_t klen =0;
    FCT_ASSERT( s != NULL && "invalid arg");
    klen = strlen(s)+1;
    k = (char*)malloc(sizeof(char)*klen+1);
    fctstr_safe_cpy(k, s, klen);
    return k;
}